

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_load(CompilerHLSL *this,Instruction *instruction)

{
  uint type;
  uint id;
  uint32_t id_00;
  Variant *pVVar1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  uint32_t *puVar4;
  ulong uVar5;
  SPIRAccessChain *chain;
  SPIRType *pSVar6;
  SPIRExpression *e;
  ulong uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  string load_expr;
  string local_70;
  string local_50;
  
  puVar4 = Compiler::stream((Compiler *)this,instruction);
  uVar5 = (ulong)puVar4[2];
  if ((uVar5 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar5].type == TypeAccessChain)) {
    chain = Variant::get<spirv_cross::SPIRAccessChain>(pVVar1 + uVar5);
  }
  else {
    chain = (SPIRAccessChain *)0x0;
  }
  if (chain == (SPIRAccessChain *)0x0) {
    CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
    return;
  }
  type = *puVar4;
  id = puVar4[1];
  id_00 = puVar4[2];
  pSVar6 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + type);
  if (((pSVar6->array).super_VectorView<unsigned_int>.buffer_size == 0) &&
     (*(int *)&(pSVar6->super_IVariant).field_0xc != 0xf)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    read_access_chain(this,&local_70,&local_50,chain);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,id_00);
    if (bVar3) {
      uVar5 = (this->super_CompilerGLSL).super_Compiler.forced_temporaries._M_h._M_bucket_count;
      uVar7 = (ulong)id % uVar5;
      p_Var8 = (this->super_CompilerGLSL).super_Compiler.forced_temporaries._M_h._M_buckets[uVar7];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var8 != (__node_base_ptr)0x0) &&
         (p_Var2 = p_Var8->_M_nxt, p_Var9 = p_Var8, id != *(uint *)&p_Var8->_M_nxt[1]._M_nxt)) {
        while (p_Var8 = p_Var2, p_Var2 = p_Var8->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar5 != uVar7) ||
             (p_Var9 = p_Var8, id == *(uint *)&p_Var2[1]._M_nxt)) goto LAB_002708af;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_002708af:
      if (p_Var9 == (__node_base_ptr)0x0) {
        bVar3 = true;
      }
      else {
        bVar3 = p_Var9->_M_nxt == (_Hash_node_base *)0x0;
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3 == false) {
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id)
      ;
    }
    bVar3 = (bool)(bVar3 & pSVar6->columns < 2);
    e = CompilerGLSL::emit_op(&this->super_CompilerGLSL,type,id,&local_70,bVar3,true);
    e->need_transpose = false;
    Compiler::register_read((Compiler *)this,id,id_00,bVar3);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,id_00);
    if (bVar3 != false) {
      Compiler::add_implied_read_expression((Compiler *)this,e,(chain->super_IVariant).self.id);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  else {
    CompilerGLSL::emit_uninitialized_temporary_expression(&this->super_CompilerGLSL,type,id);
    CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,id,true);
    read_access_chain(this,(string *)0x0,&local_70,chain);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_load(const Instruction &instruction)
{
	auto ops = stream(instruction);

	auto *chain = maybe_get<SPIRAccessChain>(ops[2]);
	if (chain)
	{
		uint32_t result_type = ops[0];
		uint32_t id = ops[1];
		uint32_t ptr = ops[2];

		auto &type = get<SPIRType>(result_type);
		bool composite_load = !type.array.empty() || type.basetype == SPIRType::Struct;

		if (composite_load)
		{
			// We cannot make this work in one single expression as we might have nested structures and arrays,
			// so unroll the load to an uninitialized temporary.
			emit_uninitialized_temporary_expression(result_type, id);
			read_access_chain(nullptr, to_expression(id), *chain);
			track_expression_read(chain->self);
		}
		else
		{
			string load_expr;
			read_access_chain(&load_expr, "", *chain);

			bool forward = should_forward(ptr) && forced_temporaries.find(id) == end(forced_temporaries);

			// If we are forwarding this load,
			// don't register the read to access chain here, defer that to when we actually use the expression,
			// using the add_implied_read_expression mechanism.
			if (!forward)
				track_expression_read(chain->self);

			// Do not forward complex load sequences like matrices, structs and arrays.
			if (type.columns > 1)
				forward = false;

			auto &e = emit_op(result_type, id, load_expr, forward, true);
			e.need_transpose = false;
			register_read(id, ptr, forward);
			inherit_expression_dependencies(id, ptr);
			if (forward)
				add_implied_read_expression(e, chain->self);
		}
	}
	else
		CompilerGLSL::emit_instruction(instruction);
}